

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O2

void __thiscall
chatra::emb::io::WriteStandardFile::WriteStandardFile
          (WriteStandardFile *this,string *fileName,Type_conflict flags,FILE *fp,size_t length,
          bool append)

{
  int iVar1;
  undefined3 in_register_00000089;
  string local_58;
  int local_34;
  
  local_34 = CONCAT31(in_register_00000089,append);
  std::__cxx11::string::string((string *)&local_58,(string *)fileName);
  StandardFileCommon::StandardFileCommon(&this->super_StandardFileCommon,&local_58,flags,fp,length);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_StandardFileCommon).super_IFile._vptr_IFile =
       (_func_int **)&PTR__StandardFileCommon_00241be0;
  if (local_34 != 0) {
    (this->super_StandardFileCommon).current = length;
    iVar1 = fseek((FILE *)fp,length,0);
    if (iVar1 != 0) {
      StandardFileCommon::doClose(&this->super_StandardFileCommon);
    }
  }
  return;
}

Assistant:

WriteStandardFile(std::string fileName, FileOpenFlags::Type flags,
			std::FILE* fp, size_t length, bool append) : StandardFileCommon(std::move(fileName), flags, fp, length) {
		if (append) {
			current = length;
			if (std::fseek(fp, static_cast<long>(length), SEEK_SET))
				doClose();
		}
	}